

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemengine_unix.cpp
# Opt level: O0

TriStateResult QFileSystemEngine::cloneFile(int srcfd,int dstfd,QFileSystemMetaData *knownData)

{
  bool bVar1;
  int iVar2;
  int *piVar3;
  undefined8 in_RDX;
  QFlagsStorage<QFileSystemMetaData::MetaDataFlag> flags;
  int in_ESI;
  uint in_EDI;
  long in_FS_OFFSET;
  ssize_t n;
  size_t SendfileSize;
  anon_class_4_1_a7d12463 destinationIsEmpty;
  stat64 statBuffer;
  undefined4 in_stack_ffffffffffffff18;
  MetaDataFlag in_stack_ffffffffffffff1c;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  undefined8 in_stack_ffffffffffffff28;
  QFlagsStorage<QFileSystemMetaData::MetaDataFlag> flags_00;
  long local_c8;
  TriStateResult local_a5;
  stat64 local_98;
  long local_8;
  
  flags_00.i = (Int)((ulong)in_stack_ffffffffffffff28 >> 0x20);
  flags.i = (Int)((ulong)in_RDX >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  memset(&local_98,0xaa,0x90);
  QFlags<QFileSystemMetaData::MetaDataFlag>::QFlags
            ((QFlags<QFileSystemMetaData::MetaDataFlag> *)
             CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),in_stack_ffffffffffffff1c
            );
  bVar1 = QFileSystemMetaData::hasFlags
                    ((QFileSystemMetaData *)
                     CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                     (MetaDataFlags)flags_00.i);
  if ((bVar1) && (bVar1 = QFileSystemMetaData::isFile((QFileSystemMetaData *)0x188994), bVar1)) {
    local_98.st_mode = 0x8000;
  }
  else {
    QFlags<QFileSystemMetaData::MetaDataFlag>::QFlags
              ((QFlags<QFileSystemMetaData::MetaDataFlag> *)
               CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
               in_stack_ffffffffffffff1c);
    bVar1 = QFileSystemMetaData::hasFlags
                      ((QFileSystemMetaData *)
                       CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                       (MetaDataFlags)flags.i);
    if ((bVar1) &&
       (bVar1 = QFileSystemMetaData::isDirectory((QFileSystemMetaData *)0x1889de), bVar1)) {
      piVar3 = __errno_location();
      *piVar3 = 0x15;
      local_a5 = Failed;
      goto LAB_00188b39;
    }
    iVar2 = fstat64(in_EDI,&local_98);
    if (iVar2 == -1) {
      local_a5 = Failed;
      goto LAB_00188b39;
    }
    if ((local_98.st_mode & 0xf000) != 0x8000) {
      local_a5 = NotSupported;
      goto LAB_00188b39;
    }
  }
  iVar2 = ioctl(in_ESI,0x40049409,(ulong)in_EDI);
  if (iVar2 == 0) {
    local_a5 = Success;
  }
  else {
    local_c8 = sendfile(in_ESI,in_EDI,(off_t *)0x0,0x7ffff000);
    if (local_c8 == -1) {
      piVar3 = __errno_location();
      if ((*piVar3 == 5) || (*piVar3 == 0x1c)) {
        local_a5 = Failed;
      }
      else {
        local_a5 = NotSupported;
      }
    }
    else {
      do {
        if (local_c8 == 0) {
          local_a5 = Success;
          goto LAB_00188b39;
        }
        local_c8 = sendfile(in_ESI,in_EDI,(off_t *)0x0,0x7ffff000);
      } while (local_c8 != -1);
      ftruncate(in_ESI,0);
      lseek(in_EDI,0,0);
      lseek(in_ESI,0,0);
      local_a5 = Failed;
    }
  }
LAB_00188b39:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_a5;
}

Assistant:

auto QFileSystemEngine::cloneFile(int srcfd, int dstfd, const QFileSystemMetaData &knownData) -> TriStateResult
{
    QT_STATBUF statBuffer;
    if (knownData.hasFlags(QFileSystemMetaData::PosixStatFlags) &&
            knownData.isFile()) {
        statBuffer.st_mode = S_IFREG;
    } else if (knownData.hasFlags(QFileSystemMetaData::PosixStatFlags) &&
               knownData.isDirectory()) {
        errno = EISDIR;
        return TriStateResult::Failed;   // fcopyfile(3) returns success on directories
    } else if (QT_FSTAT(srcfd, &statBuffer) == -1) {
        // errno was set
        return TriStateResult::Failed;
    } else if (!S_ISREG((statBuffer.st_mode))) {
        // not a regular file, let QFile do the copy
        return TriStateResult::NotSupported;
    }

    [[maybe_unused]] auto destinationIsEmpty = [dstfd]() {
        QT_STATBUF statBuffer;
        return QT_FSTAT(dstfd, &statBuffer) == 0 && statBuffer.st_size == 0;
    };
    Q_ASSERT(destinationIsEmpty());

#if defined(Q_OS_LINUX)
    // first, try FICLONE (only works on regular files and only on certain fs)
    if (::ioctl(dstfd, FICLONE, srcfd) == 0)
        return TriStateResult::Success;
#elif defined(Q_OS_DARWIN)
    // try fcopyfile
    if (fcopyfile(srcfd, dstfd, nullptr, COPYFILE_DATA | COPYFILE_STAT) == 0)
        return TriStateResult::Success;
    switch (errno) {
    case ENOTSUP:
    case ENOMEM:
        return TriStateResult::NotSupported;    // let QFile try
    }
    return TriStateResult::Failed;
#endif

#if QT_CONFIG(copy_file_range)
    // Second, try copy_file_range. Tested on Linux & FreeBSD: FreeBSD can copy
    // across mountpoints, Linux currently (6.12) can only if the source and
    // destination mountpoints are the same filesystem type.
    QT_OFF_T srcoffset = 0;
    QT_OFF_T dstoffset = 0;
    ssize_t copied;
    do {
        copied = ::copy_file_range(srcfd, &srcoffset, dstfd, &dstoffset, SSIZE_MAX, 0);
    } while (copied > 0 || (copied < 0 && errno == EINTR));
    if (copied == 0)
        return TriStateResult::Success;         // EOF -> success
    if (srcoffset) {
        // some bytes were copied, so this is a real error (like ENOSPC).
        copied = ftruncate(dstfd, 0);
        return TriStateResult::Failed;
    }
    if (errno != EXDEV)
        return TriStateResult::Failed;
#endif

#if defined(Q_OS_LINUX)
    // For Linux, try sendfile (it can send to some special types too).
    // sendfile(2) is limited in the kernel to 2G - 4k
    const size_t SendfileSize = 0x7ffff000;

    ssize_t n = ::sendfile(dstfd, srcfd, nullptr, SendfileSize);
    if (n == -1) {
        switch (errno) {
        case ENOSPC:
        case EIO:
            return TriStateResult::Failed;
        }

        // if we got an error here, give up and try at an upper layer
        return TriStateResult::NotSupported;
    }

    while (n) {
        n = ::sendfile(dstfd, srcfd, nullptr, SendfileSize);
        if (n == -1) {
            // uh oh, this is probably a real error (like ENOSPC)
            n = ftruncate(dstfd, 0);
            n = lseek(srcfd, 0, SEEK_SET);
            n = lseek(dstfd, 0, SEEK_SET);
            return TriStateResult::Failed;
        }
    }

    return TriStateResult::Success;
#else
    Q_UNUSED(dstfd);
    return TriStateResult::NotSupported;
#endif
}